

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Debug::resetColorInternal(Debug *this)

{
  Color CVar1;
  bool bVar2;
  ostream *output;
  long lVar3;
  char local_c1;
  byte local_99;
  bool local_81;
  byte local_6a;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_69;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_68;
  char local_67 [6];
  undefined1 local_61;
  undefined1 local_60;
  char code_1 [8];
  char code [10];
  Flags local_41;
  Error local_40;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_18;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_17;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_16;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_15;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_14;
  UnderlyingType local_13;
  EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> local_12;
  EnumSet local_11;
  Debug *local_10;
  Debug *this_local;
  
  local_6a = 1;
  local_10 = this;
  if (this->_output != (ostream *)0x0) {
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_12,ColorWritten);
    local_11 = (EnumSet)Containers::
                        EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
                        operator&(&this->_internalFlags,local_12);
    bVar2 = Containers::EnumSet::operator_cast_to_bool(&local_11);
    local_6a = bVar2 ^ 0xff;
  }
  if ((local_6a & 1) == 0) {
    local_13 = (UnderlyingType)Utility::operator~(ColorWritten);
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::operator&=
              (&this->_internalFlags,
               (EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_>)local_13);
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_14,ValueWritten);
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::operator|=
              (&this->_internalFlags,local_14);
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_15,PreviousColorBold);
    bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
            operator>=(&this->_internalFlags,local_15);
    local_81 = true;
    if (!bVar2) {
      Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
                (&local_16,PreviousColorInverted);
      local_81 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
                 operator>=(&this->_internalFlags,local_16);
    }
    if (local_81 == false) {
      if (this->_previousColor == Default) {
        std::operator<<(this->_output,"\x1b[0m");
      }
      else {
        builtin_strncpy(local_67,"\x1b[0;3",5);
        local_67[5] = this->_previousColor + 0x30;
        local_61 = 0x6d;
        local_60 = 0;
        std::operator<<(this->_output,local_67);
      }
    }
    else {
      Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
                (&local_17,PreviousColorBold);
      bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
              operator>=(&this->_internalFlags,local_17);
      local_99 = 1;
      if (bVar2) {
        Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_18,PreviousColorInverted);
        bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
                operator>=(&this->_internalFlags,local_18);
        local_99 = bVar2 ^ 0xff;
      }
      if (((local_99 ^ 0xff) & 1) != 0) {
        output = Error::defaultOutput();
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_41);
        Error::Error(&local_40,output,local_41);
        operator<<(&local_40.super_Debug,
                   "Assertion !(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted) failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:412"
                  );
        Error::~Error(&local_40);
        abort();
      }
      builtin_strncpy(code_1 + 1,"\x1b[0;",4);
      Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
                ((EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_> *)code_1,
                 PreviousColorBold);
      bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
              operator>=(&this->_internalFlags,
                         (EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)__xff_>)
                         code_1[0]);
      local_c1 = '1';
      if (!bVar2) {
        local_c1 = '7';
      }
      code_1[5] = local_c1;
      code_1[6] = ';';
      code_1[7] = '3';
      std::operator<<(this->_output,code_1 + 1);
    }
    CVar1 = this->_previousColor;
    lVar3 = __tls_get_addr(&PTR_001f0f78);
    *(Color *)(lVar3 + 0x18) = CVar1;
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_68,PreviousColorBold);
    bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
            operator>=(&this->_internalFlags,local_68);
    lVar3 = __tls_get_addr(&PTR_001f0f78);
    *(bool *)(lVar3 + 0x19) = bVar2;
    Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_69,PreviousColorInverted);
    bVar2 = Containers::EnumSet<Corrade::Utility::Debug::InternalFlag,_(unsigned_char)'\xff'>::
            operator>=(&this->_internalFlags,local_69);
    lVar3 = __tls_get_addr(&PTR_001f0f78);
    *(bool *)(lVar3 + 0x1a) = bVar2;
  }
  return;
}

Assistant:

inline void Debug::resetColorInternal() {
    if(!_output || !(_internalFlags & InternalFlag::ColorWritten))
        return;

    _internalFlags &= ~InternalFlag::ColorWritten;
    _internalFlags |= InternalFlag::ValueWritten;
    #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_UTILITY_USE_ANSI_COLORS)
    HANDLE h = streamOutputHandle(_output);
    if(h != INVALID_HANDLE_VALUE)
        SetConsoleTextAttribute(h, _previousColorAttributes);
    #else
    if(_internalFlags >= InternalFlag::PreviousColorBold || _internalFlags >= InternalFlag::PreviousColorInverted) {
        /* Only one of the two should be set by our code */
        CORRADE_INTERNAL_ASSERT(!(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted));
        const char code[]{'\033', '[', '0', ';', _internalFlags >= InternalFlag::PreviousColorBold ? '1' : '7', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else if(_previousColor != Color::Default) {
        const char code[]{'\033', '[', '0', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else *_output << "\033[0m";

    debugGlobals.color = _previousColor;
    debugGlobals.colorBold = _internalFlags >= InternalFlag::PreviousColorBold;
    debugGlobals.colorInverted = _internalFlags >= InternalFlag::PreviousColorInverted;
    #endif
}